

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

MatrixXd * __thiscall
Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,Tools *this,VectorXd *x_state)

{
  CoeffReturnType pdVar1;
  ostream *this_00;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  double dVar3;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  Scalar local_b8;
  Scalar local_b0;
  double local_a8;
  double local_a0;
  Scalar local_98;
  Scalar local_90;
  double local_88;
  double local_80;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_78;
  float local_54;
  float local_50;
  float c3;
  float c2;
  float c1;
  float vy;
  float vx;
  float py;
  float local_30;
  int local_2c;
  float px;
  undefined1 local_21;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_20;
  VectorXd *x_state_local;
  Tools *this_local;
  MatrixXd *Hj;
  
  local_21 = 0;
  px = 4.2039e-45;
  local_2c = 4;
  local_20 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_state;
  x_state_local = (VectorXd *)this;
  this_local = (Tools *)__return_storage_ptr__;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)&px,&local_2c);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,0)
  ;
  local_30 = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,1)
  ;
  vy = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,2)
  ;
  c1 = (float)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()(local_20,3)
  ;
  c2 = (float)*pdVar1;
  c3 = local_30 * local_30 + vy * vy;
  dVar3 = sqrt((double)c3);
  local_50 = (float)dVar3;
  local_54 = c3 * local_50;
  if (0.0001 <= ABS(c3)) {
    local_80 = (double)(local_30 / local_50);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
              (&local_78,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               &local_80);
    local_88 = (double)(vy / local_50);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_78,&local_88);
    local_90 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_90);
    local_98 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_98);
    local_a0 = (double)-(vy / c3);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a0);
    local_a8 = (double)(local_30 / c3);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_a8);
    local_b0 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b0);
    local_b8 = 0.0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_b8);
    local_c0 = (double)((vy * (c1 * vy - c2 * local_30)) / local_54);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_c0);
    local_c8 = (double)((local_30 * (local_30 * c2 - vy * c1)) / local_54);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_c8);
    local_d0 = (double)(local_30 / local_50);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar2,&local_d0);
    local_d8 = (double)(vy / local_50);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_d8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_78)
    ;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "CalculateJacobian () - Error - Division by Zero");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return __return_storage_ptr__;
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {
  /**
  TODO:
    * Calculate a Jacobian here.
  */
  MatrixXd Hj(3, 4);
  //recover state parameters
  float px = x_state(0);
  float py = x_state(1);
  float vx = x_state(2);
  float vy = x_state(3);

  //pre-compute a set of terms to avoid repeated calculation
  float c1 = px*px + py*py;
  float c2 = sqrt(c1);
  float c3 = (c1*c2);

  //check division by zero
  if (fabs(c1) < 0.0001){
      std::cout << "CalculateJacobian () - Error - Division by Zero" << std::endl;
      return Hj;
  }

  //compute the Jacobian matrix
  Hj << (px / c2), (py / c2), 0, 0,
      -(py / c1), (px / c1), 0, 0,
      py*(vx*py - vy*px) / c3, px*(px*vy - py*vx) / c3, px / c2, py / c2;

  return Hj;
}